

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void __thiscall APlayerPawn::RemoveInventory(APlayerPawn *this,AInventory *item)

{
  bool bVar1;
  AInventory *pAVar2;
  bool pickWeap;
  AInventory *item_local;
  APlayerPawn *this_local;
  
  bVar1 = false;
  if ((this->super_AActor).player != (player_t *)0x0) {
    bVar1 = TObjPtr<AInventory>::operator==(&this->InvSel,item);
    if (bVar1) {
      pAVar2 = AInventory::NextInv(item);
      TObjPtr<AInventory>::operator=(&this->InvSel,pAVar2);
      bVar1 = TObjPtr<AInventory>::operator==(&this->InvSel,(AInventory *)0x0);
      if (bVar1) {
        pAVar2 = AInventory::PrevInv(item);
        TObjPtr<AInventory>::operator=(&this->InvSel,pAVar2);
      }
    }
    bVar1 = TObjPtr<AInventory>::operator==(&this->InvFirst,item);
    if (bVar1) {
      pAVar2 = AInventory::NextInv(item);
      TObjPtr<AInventory>::operator=(&this->InvFirst,pAVar2);
      bVar1 = TObjPtr<AInventory>::operator==(&this->InvFirst,(AInventory *)0x0);
      if (bVar1) {
        pAVar2 = AInventory::PrevInv(item);
        TObjPtr<AInventory>::operator=(&this->InvFirst,pAVar2);
      }
    }
    if ((AWeapon *)item == ((this->super_AActor).player)->PendingWeapon) {
      ((this->super_AActor).player)->PendingWeapon = (AWeapon *)AWeapon::RegistrationInfo.MyClass;
    }
    bVar1 = (AWeapon *)item == ((this->super_AActor).player)->ReadyWeapon;
    if (bVar1) {
      ((this->super_AActor).player)->ReadyWeapon = (AWeapon *)0x0;
      ((this->super_AActor).player)->refire = 0;
    }
  }
  AActor::RemoveInventory(&this->super_AActor,item);
  if (((bVar1) && (((this->super_AActor).player)->mo == this)) &&
     (((this->super_AActor).player)->PendingWeapon == (AWeapon *)AWeapon::RegistrationInfo.MyClass))
  {
    PickNewWeapon(this,(PClassAmmo *)0x0);
  }
  return;
}

Assistant:

void APlayerPawn::RemoveInventory (AInventory *item)
{
	bool pickWeap = false;

	// Since voodoo dolls aren't supposed to have an inventory, there should be
	// no need to redirect them to the real player here as there is with AddInventory.

	// If the item removed is the selected one, select something else, either the next
	// item, if there is one, or the previous item.
	if (player != NULL)
	{
		if (InvSel == item)
		{
			InvSel = item->NextInv ();
			if (InvSel == NULL)
			{
				InvSel = item->PrevInv ();
			}
		}
		if (InvFirst == item)
		{
			InvFirst = item->NextInv ();
			if (InvFirst == NULL)
			{
				InvFirst = item->PrevInv ();
			}
		}
		if (item == player->PendingWeapon)
		{
			player->PendingWeapon = WP_NOCHANGE;
		}
		if (item == player->ReadyWeapon)
		{
			// If the current weapon is removed, clear the refire counter and pick a new one.
			pickWeap = true;
			player->ReadyWeapon = NULL;
			player->refire = 0;
		}
	}
	Super::RemoveInventory (item);
	if (pickWeap && player->mo == this && player->PendingWeapon == WP_NOCHANGE)
	{
		PickNewWeapon (NULL);
	}
}